

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_a<ncnn::BinaryOp_x86_avx_functor::binary_op_sub>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [32];
  int in_ECX;
  undefined8 *in_RDX;
  uint *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  __m128 _outp_2;
  __m128 _b_2;
  __m256 _outp_1;
  __m256 _b_1;
  __m128 _b1;
  __m128 _b0;
  __m256 _p_256;
  __m128 _p_1;
  int i_1;
  __m256 _outp;
  __m256 _b;
  __m256 _p;
  int i;
  binary_op_sub op;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  int local_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  int local_2d0;
  undefined8 *local_2c0;
  uint *local_2b8;
  undefined8 uStack_170;
  undefined8 uStack_168;
  
  local_2c0 = in_RDX;
  local_2b8 = in_RSI;
  if (in_R8D == 8) {
    local_2d0 = 0;
    auVar5 = *in_RDI;
    for (; local_2d0 < in_ECX; local_2d0 = local_2d0 + 1) {
      uVar1 = *local_2b8;
      auVar2 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar1),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar1),0x30);
      auVar3 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar1),0x20);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar1),0x30);
      uStack_170 = auVar2._0_8_;
      uStack_168 = auVar2._8_8_;
      auVar4._16_8_ = uStack_170;
      auVar4._0_16_ = auVar3;
      auVar4._24_8_ = uStack_168;
      auVar4 = vsubps_avx(auVar5,auVar4);
      local_340 = auVar4._0_8_;
      uStack_338 = auVar4._8_8_;
      uStack_330 = auVar4._16_8_;
      uStack_328 = auVar4._24_8_;
      *local_2c0 = local_340;
      local_2c0[1] = uStack_338;
      local_2c0[2] = uStack_330;
      local_2c0[3] = uStack_328;
      local_2b8 = local_2b8 + 1;
      local_2c0 = local_2c0 + 4;
    }
  }
  if (in_R8D == 4) {
    local_344 = 0;
    uVar6 = *(undefined8 *)*in_RDI;
    uVar7 = *(undefined8 *)(*in_RDI + 8);
    auVar3 = *(undefined1 (*) [16])*in_RDI;
    auVar2 = *(undefined1 (*) [16])*in_RDI;
    for (; local_344 + 1 < in_ECX; local_344 = local_344 + 2) {
      uVar1 = *local_2b8;
      auVar5._4_4_ = uVar1;
      auVar5._0_4_ = uVar1;
      auVar5._12_4_ = uVar1;
      auVar5._8_4_ = uVar1;
      uVar1 = local_2b8[1];
      auVar5._20_4_ = uVar1;
      auVar5._16_4_ = uVar1;
      auVar5._28_4_ = uVar1;
      auVar5._24_4_ = uVar1;
      auVar8._16_8_ = uVar6;
      auVar8._0_16_ = auVar2;
      auVar8._24_8_ = uVar7;
      auVar5 = vsubps_avx(auVar8,auVar5);
      local_3e0 = auVar5._0_8_;
      uStack_3d8 = auVar5._8_8_;
      uStack_3d0 = auVar5._16_8_;
      uStack_3c8 = auVar5._24_8_;
      *local_2c0 = local_3e0;
      local_2c0[1] = uStack_3d8;
      local_2c0[2] = uStack_3d0;
      local_2c0[3] = uStack_3c8;
      local_2b8 = local_2b8 + 2;
      local_2c0 = local_2c0 + 4;
    }
    for (; local_344 < in_ECX; local_344 = local_344 + 1) {
      uVar1 = *local_2b8;
      auVar2._4_4_ = uVar1;
      auVar2._0_4_ = uVar1;
      auVar2._12_4_ = uVar1;
      auVar2._8_4_ = uVar1;
      auVar2 = vsubps_avx(auVar3,auVar2);
      local_400 = auVar2._0_8_;
      uStack_3f8 = auVar2._8_8_;
      *local_2c0 = local_400;
      local_2c0[1] = uStack_3f8;
      local_2b8 = local_2b8 + 1;
      local_2c0 = local_2c0 + 2;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_a(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        __m512 _p = _mm512_loadu_ps(ptr);
        for (; i < w; i++)
        {
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
        __m256 _p = _mm256_loadu_ps(ptr);
#if __AVX512F__
        __m512 _p_512 = _mm512_insertf32x8(_mm512_castps256_ps512(_p), _p, 1);
        for (; i + 1 < w; i += 2)
        {
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p_512, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
        __m128 _p = _mm_loadu_ps(ptr);
#if __AVX__
        __m256 _p_256 = _mm256_insertf128_ps(_mm256_castps128_ps256(_p), _p, 1);
#if __AVX512F__
        __m512 _p_512 = _mm512_insertf32x8(_mm512_castps256_ps512(_p_256), _p_256, 1);
        for (; i + 3 < w; i += 4)
        {
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p_512, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p_256, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}